

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v5::internal::
       format_decimal<unsigned_int,char,fmt::v5::internal::add_thousands_sep<char>>
                 (char *buffer,uint value,int num_digits,add_thousands_sep<char> thousands_sep)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  char *local_40;
  char *local_38;
  
  if (-1 < num_digits) {
    local_40 = buffer + (uint)num_digits;
    uVar2 = (ulong)value;
    local_38 = local_40;
    while( true ) {
      if ((uint)uVar2 < 100) break;
      cVar1 = basic_data<void>::DIGITS[(uVar2 % 100) * 2];
      local_40[-1] = basic_data<void>::DIGITS[(uVar2 % 100) * 2 + 1];
      local_40 = local_40 + -1;
      add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
      local_40[-1] = cVar1;
      local_40 = local_40 + -1;
      add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
      uVar2 = uVar2 / 100;
    }
    if ((uint)uVar2 < 10) {
      bVar3 = (byte)uVar2 | 0x30;
    }
    else {
      local_40[-1] = basic_data<void>::DIGITS[(uVar2 * 2 & 0xffffffff) + 1];
      local_40 = local_40 + -1;
      add_thousands_sep<char>::operator()(&thousands_sep,&local_40);
      bVar3 = basic_data<void>::DIGITS[uVar2 * 2];
    }
    local_40[-1] = bVar3;
    return local_38;
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3c0,
                "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned int, Char = char, ThousandsSep = fmt::internal::add_thousands_sep<char>]"
               );
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}